

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O2

void apply_colormap(ColorMap *map)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ColorMap *pCVar8;
  
  lVar7 = 0;
  do {
    pCVar8 = &color_map;
    if (lVar7 == 7) {
      return;
    }
    iVar6 = (int)lVar7;
    if (iVar6 == 0) {
      sVar1 = -1;
    }
    else {
      if (iVar6 == 1) {
        iVar4 = 0x70;
        if (_COLORS < 0x10) {
          iVar4 = 0x38;
        }
        if (_COLOR_PAIRS <= iVar4) {
          return;
        }
      }
      sVar1 = color_map.bgColors[lVar7];
    }
    for (uVar5 = 0; uVar5 < (ulong)(0xf < _COLORS) * 8 + 8; uVar5 = uVar5 + 1) {
      sVar3 = pCVar8->fgColors[0];
      sVar2 = sVar3;
      if (settings.darkgray == '\0') {
        sVar2 = 4;
      }
      if (sVar3 != 0) {
        sVar2 = sVar3;
      }
      sVar3 = 0;
      if (sVar2 == -1) {
        sVar3 = sVar2;
      }
      if (sVar2 == sVar1) {
        sVar2 = sVar3;
      }
      iVar4 = (iVar6 << (4U - (_COLORS < 0x10) & 0x1f)) + (int)uVar5 + 1;
      init_pair((int)(short)iVar4,(int)sVar2,(int)sVar1,iVar4);
      pCVar8 = (ColorMap *)(pCVar8->fgColors + 1);
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static void apply_colormap(struct ColorMap *map)
{
    int bg, fg;
    short bgColor, fgColor;

    /* Set up all color pairs.
     * If using bold, then set up color pairs for foreground colors
     *   0-7; if not, then set up color pairs for foreground colors
     *   0-15.
     * If there are sufficient color pairs, then set them up for 6
     * possible non-default background colors (don't use white, there
     * are terminals that hate it).  So there are 112 pairs required
     * for 16 colors, or 56 required for 8 colors. */
    for (bg = 0; bg < BG_COLOR_COUNT; bg++) {
	/* Do not set up background colors if there are not enough
	 * color pairs. */
	if (bg == 1 && !BG_COLOR_SUPPORT)
	    break;

	/* For no background, use the default background color;
	 * otherwise use the color from the color map. */
	bgColor = bg ? map->bgColors[bg] : -1;

	for (fg = 0; fg < FG_COLOR_COUNT; fg++) {
	    fgColor = map->fgColors[fg];

	    /* Replace black with blue if darkgray is not set. */
	    if (fgColor == COLOR_BLACK && !settings.darkgray)
		fgColor = COLOR_BLUE;
	    if (fgColor == bgColor && fgColor != -1)
		fgColor = COLOR_BLACK;

	    init_pair(bg * FG_COLOR_COUNT + fg + 1, fgColor, bgColor);
	}
    }

    return;
}